

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_serialize_struct
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  string sStack_38;
  
  t_generator::indent_abi_cxx11_(&sStack_38,(t_generator *)this);
  poVar1 = std::operator<<(out,(string *)&sStack_38);
  poVar1 = std::operator<<(poVar1,"await ");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,".WriteAsync(oprot, ");
  poVar1 = std::operator<<(poVar1,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,");");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void t_netstd_generator::generate_serialize_struct(ostream& out, t_struct* tstruct, string prefix)
{
    (void)tstruct;
    out << indent() << "await " << prefix << ".WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
}